

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::DeepTiledInputFile::initialize(DeepTiledInputFile *this)

{
  int maxX;
  int minY;
  int maxY;
  size_t __n;
  char *pcVar1;
  uint uVar2;
  LevelMode LVar3;
  LevelRoundingMode LVar4;
  int iVar5;
  Format FVar6;
  string *psVar7;
  int *piVar8;
  TileDescription *pTVar9;
  LineOrder *pLVar10;
  Box2i *pBVar11;
  TileBuffer *pTVar12;
  char *pcVar13;
  Compression *pCVar14;
  Compressor *pCVar15;
  ChannelList *this_00;
  const_iterator cVar16;
  const_iterator cVar17;
  ConstIterator CVar18;
  ostream *poVar19;
  ArgExc *pAVar20;
  ulong uVar21;
  Data *pDVar22;
  ConstIterator tmp;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1c8;
  stringstream _iex_throw_s;
  int iStack_1ac;
  int local_1a8;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1a0 [15];
  
  if (this->_data->partNumber == -1) {
    psVar7 = Header::type_abi_cxx11_(&this->_data->header);
    __n = psVar7->_M_string_length;
    if ((__n != _DAT_031a5dd8) ||
       ((__n != 0 && (iVar5 = bcmp((psVar7->_M_dataplus)._M_p,DEEPTILE_abi_cxx11_,__n), iVar5 != 0))
       )) {
      pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar20,"Expected a deep tiled file but the file is not deep tiled.");
      __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  piVar8 = Header::version(&this->_data->header);
  if (*piVar8 != 1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Version ",8);
    piVar8 = Header::version(&this->_data->header);
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,*piVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19," not supported for deeptiled images in this version of the library",0x42);
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  Header::sanityCheck(&this->_data->header,true,false);
  pTVar9 = Header::tileDescription(&this->_data->header);
  pDVar22 = this->_data;
  uVar2 = pTVar9->ySize;
  LVar3 = pTVar9->mode;
  LVar4 = pTVar9->roundingMode;
  (pDVar22->tileDesc).xSize = pTVar9->xSize;
  (pDVar22->tileDesc).ySize = uVar2;
  (pDVar22->tileDesc).mode = LVar3;
  (pDVar22->tileDesc).roundingMode = LVar4;
  pLVar10 = Header::lineOrder(&this->_data->header);
  pDVar22 = this->_data;
  pDVar22->lineOrder = *pLVar10;
  pBVar11 = Header::dataWindow(&pDVar22->header);
  iVar5 = (pBVar11->min).x;
  pDVar22 = this->_data;
  pDVar22->minX = iVar5;
  maxX = (pBVar11->max).x;
  pDVar22->maxX = maxX;
  minY = (pBVar11->min).y;
  pDVar22->minY = minY;
  maxY = (pBVar11->max).y;
  pDVar22->maxY = maxY;
  precalculateTileInfo
            (&pDVar22->tileDesc,iVar5,maxX,minY,maxY,&pDVar22->numXTiles,&pDVar22->numYTiles,
             &pDVar22->numXLevels,&pDVar22->numYLevels);
  pDVar22 = this->_data;
  TileOffsets::TileOffsets
            ((TileOffsets *)&_iex_throw_s,(pDVar22->tileDesc).mode,pDVar22->numXLevels,
             pDVar22->numYLevels,pDVar22->numXTiles,pDVar22->numYTiles);
  pDVar22 = this->_data;
  (pDVar22->tileOffsets)._numYLevels = local_1a8;
  (pDVar22->tileOffsets)._mode = __iex_throw_s;
  (pDVar22->tileOffsets)._numXLevels = iStack_1ac;
  local_1c8.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pDVar22->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1c8.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pDVar22->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1c8.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pDVar22->tileOffsets)._offsets.
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pDVar22->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1a0[0].
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pDVar22->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1a0[0].
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pDVar22->tileOffsets)._offsets.
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1a0[0].
       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1a0[0].
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0[0].
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0[0].
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&local_1c8);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(local_1a0);
  pDVar22 = this->_data;
  if ((pDVar22->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar22->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar21 = 0;
    do {
      pTVar12 = (TileBuffer *)operator_new(0xa0);
      (pTVar12->exception)._M_dataplus._M_p = (pointer)0x0;
      pTVar12->uncompressedData = (char *)0x0;
      pTVar12->buffer = (char *)0x0;
      pTVar12->dataSize = 0;
      *(undefined4 *)&pTVar12->field_0x14 = 0;
      pTVar12->compressor = (Compressor *)0x0;
      pTVar12->format = NATIVE;
      pTVar12->dx = 0;
      pTVar12->dy = 0;
      pTVar12->lx = 0;
      FVar6 = defaultFormat((Compressor *)0x0);
      *(Format *)&(pTVar12->exception)._M_string_length = FVar6;
      *(undefined4 *)((long)&(pTVar12->exception)._M_string_length + 4) = 0xffffffff;
      *(undefined4 *)&(pTVar12->exception).field_2 = 0xffffffff;
      *(undefined4 *)((long)&(pTVar12->exception).field_2 + 4) = 0xffffffff;
      *(undefined4 *)((long)&(pTVar12->exception).field_2 + 8) = 0xffffffff;
      (pTVar12->exception).field_2._M_local_buf[0xc] = '\0';
      *(undefined1 **)&(pTVar12->_sem).field_0x0 = &pTVar12->field_0x60 + 8;
      *(undefined8 *)&pTVar12->field_0x60 = 0;
      (&pTVar12->field_0x60)[8] = 0;
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(&pTVar12->field_0x70 + 8),1);
      (this->_data->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar21] = pTVar12;
      uVar21 = uVar21 + 1;
      pDVar22 = this->_data;
    } while (uVar21 < (ulong)((long)(pDVar22->tileBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pDVar22->tileBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  uVar21 = (ulong)((pDVar22->tileDesc).xSize * (pDVar22->tileDesc).ySize) << 2;
  pDVar22->maxSampleCountTableSize = uVar21;
  pcVar13 = (char *)operator_new__(uVar21);
  pcVar1 = (pDVar22->sampleCountTableBuffer)._data;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (pDVar22->sampleCountTableBuffer)._size = uVar21;
  (pDVar22->sampleCountTableBuffer)._data = pcVar13;
  pCVar14 = Header::compression(&this->_data->header);
  pCVar15 = newCompressor(*pCVar14,this->_data->maxSampleCountTableSize,&this->_data->header);
  pDVar22 = this->_data;
  pDVar22->sampleCountTableComp = pCVar15;
  this_00 = Header::channels(&pDVar22->header);
  this->_data->combinedSampleSize = 0;
  cVar16._M_node = (_Base_ptr)ChannelList::begin(this_00);
  cVar17._M_node = (_Base_ptr)ChannelList::end(this_00);
  if (cVar16._M_node != cVar17._M_node) {
    do {
      if (2 < (ulong)cVar16._M_node[9]._M_color) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Bad type for channel ",0x15);
        poVar19 = std::operator<<((ostream *)local_1a0,(char *)(cVar16._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19," initializing deepscanline reader",0x21);
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      piVar8 = &this->_data->combinedSampleSize;
      *piVar8 = *piVar8 + *(int *)(&DAT_03089f80 + (ulong)cVar16._M_node[9]._M_color * 4);
      cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node);
      CVar18 = ChannelList::end(this_00);
    } while ((const_iterator)cVar16._M_node != CVar18._i._M_node);
  }
  return;
}

Assistant:

void
DeepTiledInputFile::initialize ()
{
    if (_data->partNumber == -1)
        if (_data->header.type() != DEEPTILE)
            throw IEX_NAMESPACE::ArgExc ("Expected a deep tiled file but the file is not deep tiled.");
   if(_data->header.version()!=1)
   {
       THROW(IEX_NAMESPACE::ArgExc, "Version " << _data->header.version() << " not supported for deeptiled images in this version of the library");
   }
        
    _data->header.sanityCheck (true);

    _data->tileDesc = _data->header.tileDescription();
    _data->lineOrder = _data->header.lineOrder();

    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
                          _data->minX, _data->maxX,
                          _data->minY, _data->maxY,
                          _data->numXTiles, _data->numYTiles,
                          _data->numXLevels, _data->numYLevels);

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
                                      _data->numXLevels,
                                      _data->numYLevels,
                                      _data->numXTiles,
                                      _data->numYTiles);

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
        _data->tileBuffers[i] = new TileBuffer ();

    _data->maxSampleCountTableSize = _data->tileDesc.ySize *
                                     _data->tileDesc.xSize *
                                     sizeof(int);

    _data->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

    _data->sampleCountTableComp = newCompressor(_data->header.compression(),
                                                _data->maxSampleCountTableSize,
                                                _data->header);
                                                
                                                
    const ChannelList & c=_data->header.channels();
    _data->combinedSampleSize=0;
    for(ChannelList::ConstIterator i=c.begin();i!=c.end();i++)
    {
        switch( i.channel().type )
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF  :
                _data->combinedSampleSize+=Xdr::size<half>();
                break;
            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT :
                _data->combinedSampleSize+=Xdr::size<float>();
                break;
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT  :
                _data->combinedSampleSize+=Xdr::size<unsigned int>();
                break;
            default :
                THROW(IEX_NAMESPACE::ArgExc, "Bad type for channel " << i.name() << " initializing deepscanline reader");
        }
    }
                                                  
}